

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdg.c
# Opt level: O2

char * strip_slash(char *str)

{
  size_t sVar1;
  char *pcVar2;
  
  if ((str != (char *)0x0) && (sVar1 = strlen(str), sVar1 != 0)) {
    pcVar2 = str + sVar1;
    while( true ) {
      pcVar2 = pcVar2 + -1;
      if (pcVar2 < str) {
        return str;
      }
      if (*pcVar2 != '/') break;
      *pcVar2 = '\0';
    }
    return str;
  }
  return (char *)0x0;
}

Assistant:

static inline char*
strip_slash(char *str)
{
   // if you get invalid read of size 4 here with valgrind
   // it means that you compiled with O2 or higher optimizations on gcc
   // gcc has builtin optimized strlen that reads bytes in aligned chunks

   size_t size;
   if (!str || !(size = strlen(str)))
      return NULL;

   for (char *s = str + size - 1; s >= str && *s == '/'; --s)
      *s = 0;

   return str;
}